

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-spoil.c
# Opt level: O0

void spoil_mon_desc(char *fname)

{
  ushort uVar1;
  monster_race *pmVar2;
  _Bool _Var3;
  void *base;
  char *pcVar4;
  size_t sVar5;
  size_t u8len;
  char *name;
  monster_race *race_1;
  monster_race *race;
  uint16_t *who;
  char exp [80];
  char hp [80];
  char ac [80];
  char spd [80];
  char rar [80];
  char lev [80];
  char nam [80];
  char buf [1024];
  wchar_t n;
  wchar_t i;
  char *fname_local;
  
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  path_build(nam + 0x48,0x400,ANGBAND_DIR_USER,fname);
  fh = file_open(nam + 0x48,MODE_WRITE,FTYPE_TEXT);
  if (fh == (ang_file *)0x0) {
    msg("Cannot create spoiler file.");
  }
  else {
    file_putf(fh,"Monster Spoilers for %s\n",buildid);
    file_putf(fh,"------------------------------------------\n\n");
    file_putf(fh,"%-40.40s%4s%4s%6s%8s%4s  %11.11s\n","Name","Lev","Rar","Spd","Hp","Ac",
              "Visual Info");
    file_putf(fh,"%-40.40s%4s%4s%6s%8s%4s  %11.11s\n","----","---","---","---","--","--",
              "-----------");
    base = mem_zalloc((ulong)z_info->r_max << 1);
    buf[0x3fc] = '\x01';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
    for (; (int)buf._1020_4_ < (int)(z_info->r_max - 1); buf._1020_4_ = buf._1020_4_ + 1) {
      if (r_info[(int)buf._1020_4_].name != (char *)0x0) {
        *(short *)((long)base + (long)(int)buf._1016_4_ * 2) = (short)buf._1020_4_;
        buf._1016_4_ = buf._1016_4_ + 1;
      }
    }
    sort(base,(long)(int)buf._1016_4_,2,cmp_monsters);
    buf[0x3fc] = '\0';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
    for (; pmVar2 = r_info, (int)buf._1020_4_ < (int)buf._1016_4_; buf._1020_4_ = buf._1020_4_ + 1)
    {
      uVar1 = *(ushort *)((long)base + (long)(int)buf._1020_4_ * 2);
      pcVar4 = r_info[uVar1].name;
      _Var3 = flag_has_dbg(r_info[uVar1].flags,0xb,2,"race->flags","RF_QUESTOR");
      if (_Var3) {
        strnfmt(lev + 0x48,0x50,"[Q] %s",pcVar4);
      }
      else {
        _Var3 = flag_has_dbg(pmVar2[uVar1].flags,0xb,1,"race->flags","RF_UNIQUE");
        if (_Var3) {
          strnfmt(lev + 0x48,0x50,"[U] %s",pcVar4);
        }
        else {
          strnfmt(lev + 0x48,0x50,"The %s",pcVar4);
        }
      }
      strnfmt(rar + 0x48,0x50,"%d",(ulong)(uint)pmVar2[uVar1].level);
      strnfmt(spd + 0x48,0x50,"%d",(ulong)(uint)pmVar2[uVar1].rarity);
      if (pmVar2[uVar1].speed < L'n') {
        strnfmt(ac + 0x48,0x50,"-%d",(ulong)(uint)(0x6e - pmVar2[uVar1].speed));
      }
      else {
        strnfmt(ac + 0x48,0x50,"+%d",(ulong)(uint)(pmVar2[uVar1].speed + L'\xffffff92'));
      }
      strnfmt(hp + 0x48,0x50,"%d",(ulong)(uint)pmVar2[uVar1].ac);
      strnfmt(exp + 0x48,0x50,"%d",(ulong)(uint)pmVar2[uVar1].avg_hp);
      strnfmt((char *)&who,0x50,"%ld",(long)pmVar2[uVar1].mexp);
      pcVar4 = attr_to_text(pmVar2[uVar1].d_attr);
      strnfmt((char *)&who,0x50,"%s \'%c\'",pcVar4,(ulong)(uint)pmVar2[uVar1].d_char);
      sVar5 = utf8_strlen(lev + 0x48);
      if (sVar5 < 0x28) {
        file_putf(fh,"%s%*s",lev + 0x48,(ulong)(0x28 - (int)sVar5)," ");
      }
      else {
        if (0x28 < sVar5) {
          utf8_clipto(lev + 0x48,0x28);
        }
        file_putf(fh,"%s",lev + 0x48);
      }
      file_putf(fh,"%4s%4s%6s%8s%4s  %11.11s\n",rar + 0x48,spd + 0x48,ac + 0x48,exp + 0x48,hp + 0x48
                ,&who);
    }
    file_putf(fh,"\n");
    mem_free(base);
    _Var3 = file_close(fh);
    if (_Var3) {
      msg("Successfully created a spoiler file.");
    }
    else {
      msg("Cannot close spoiler file.");
    }
  }
  return;
}

Assistant:

void spoil_mon_desc(const char *fname)
{
	int i, n = 0;

	char buf[1024];

	char nam[80];
	char lev[80];
	char rar[80];
	char spd[80];
	char ac[80];
	char hp[80];
	char exp[80];

	uint16_t *who;

	/* Build the filename */
	path_build(buf, sizeof(buf), ANGBAND_DIR_USER, fname);
	fh = file_open(buf, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fh) {
		msg("Cannot create spoiler file.");
		return;
	}

	/* Dump the header */
	file_putf(fh, "Monster Spoilers for %s\n", buildid);
	file_putf(fh, "------------------------------------------\n\n");

	/* Dump the header */
	file_putf(fh, "%-40.40s%4s%4s%6s%8s%4s  %11.11s\n",
	        "Name", "Lev", "Rar", "Spd", "Hp", "Ac", "Visual Info");
	file_putf(fh, "%-40.40s%4s%4s%6s%8s%4s  %11.11s\n",
	        "----", "---", "---", "---", "--", "--", "-----------");

	/* Allocate the "who" array */
	who = mem_zalloc(z_info->r_max * sizeof(uint16_t));

	/* Scan the monsters (except the ghost) */
	for (i = 1; i < z_info->r_max - 1; i++) {
		struct monster_race *race = &r_info[i];

		/* Use that monster */
		if (race->name) who[n++] = (uint16_t)i;
	}

	/* Sort the array by dungeon depth of monsters */
	sort(who, n, sizeof(*who), cmp_monsters);

	/* Scan again */
	for (i = 0; i < n; i++) {
		struct monster_race *race = &r_info[who[i]];
		const char *name = race->name;
		size_t u8len;

		/* Get the "name" */
		if (rf_has(race->flags, RF_QUESTOR))
			strnfmt(nam, sizeof(nam), "[Q] %s", name);
		else if (rf_has(race->flags, RF_UNIQUE))
			strnfmt(nam, sizeof(nam), "[U] %s", name);
		else
			strnfmt(nam, sizeof(nam), "The %s", name);

		/* Level */
		strnfmt(lev, sizeof(lev), "%d", race->level);

		/* Rarity */
		strnfmt(rar, sizeof(rar), "%d", race->rarity);

		/* Speed */
		if (race->speed >= 110)
			strnfmt(spd, sizeof(spd), "+%d", (race->speed - 110));
		else
			strnfmt(spd, sizeof(spd), "-%d", (110 - race->speed));

		/* Armor Class */
		strnfmt(ac, sizeof(ac), "%d", race->ac);

		/* Hitpoints */
		strnfmt(hp, sizeof(hp), "%d", race->avg_hp);

		/* Experience */
		strnfmt(exp, sizeof(exp), "%ld", (long)(race->mexp));

		/* Hack -- use visual instead */
		strnfmt(exp, sizeof(exp), "%s '%c'", attr_to_text(race->d_attr),
				race->d_char);

		/*
		 * Dump the info.  The rationale for handling the first column
		 * separately is the same as in spoil_obj_desc():  better
		 * alignment if there are multibyte characters in the name.
		 */
		u8len = utf8_strlen(nam);
		if (u8len < 40) {
			file_putf(fh, "%s%*s", nam, (int) (40 - u8len), " ");
		} else {
			if (u8len > 40) {
				utf8_clipto(nam, 40);
			}
			file_putf(fh, "%s", nam);
		}
		file_putf(fh, "%4s%4s%6s%8s%4s  %11.11s\n",
		        lev, rar, spd, hp, ac, exp);
	}

	/* End it */
	file_putf(fh, "\n");

	/* Free the "who" array */
	mem_free(who);

	/* Check for errors */
	if (!file_close(fh)) {
		msg("Cannot close spoiler file.");
		return;
	}

	/* Worked */
	msg("Successfully created a spoiler file.");
}